

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O0

int arguments(int isPrototype,object *proc,int parBlkSize)

{
  object *first;
  int parSize;
  int parBlkSize_local;
  object *proc_local;
  int isPrototype_local;
  
  first._0_4_ = 0;
  if (currentSymbol == 0x25e) {
    getSymbol();
    first._0_4_ = parBlkSize;
    if (isPrototype == 1) {
      proc->hasArguments = 0;
    }
    else if (proc->hasArguments == 1) {
      mark("prototype requires at least one argument");
      exit(-1);
    }
  }
  else if ((((currentSymbol == 0x25f) || (currentSymbol == 0x261)) || (currentSymbol == 0x26d)) ||
          (currentSymbol == 0x268)) {
    if (isPrototype == 1) {
      proc->hasArguments = 1;
    }
    else if ((proc->hasArguments == 0) && (proc->hasPrototype == 1)) {
      mark("prototype requires void");
      exit(-1);
    }
    first._0_4_ = argumentList(isPrototype,proc,parBlkSize);
  }
  return (int)first;
}

Assistant:

procedure 
int arguments(int isPrototype, struct object *proc, int parBlkSize) {
	variable int parSize;
	variable struct object *first;
	parSize = 0; first = NULL;
	if (currentSymbol == SYMBOL_VOID) {
		getSymbol();
		if (isPrototype == 1) {
			proc->hasArguments = false;
		} else {
			if (proc->hasArguments == true) {
				mark("prototype requires at least one argument");
				exit(-1);
			}
		}
		parSize = parBlkSize + 0;
	} elsif ((currentSymbol == SYMBOL_INT) || (currentSymbol == SYMBOL_CHAR)  || 
		(currentSymbol == SYMBOL_BOOL) || (currentSymbol == SYMBOL_STRUCT)) {
			if (isPrototype == 1 ) {
				proc->hasArguments = true;
			} else {
				if ((proc->hasArguments == false) && (proc->hasPrototype == true)) {
					mark("prototype requires void");
					exit(-1);
				}
			}
			parSize = argumentList(isPrototype,proc,parBlkSize);
	}
	return parSize;
}